

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int uv_timer_again(uv_timer_t *handle)

{
  uint64_t in_RDI;
  uv_timer_t *unaff_retaddr;
  uv_timer_t *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(long *)(in_RDI + 0x60) == 0) {
    iVar1 = -0x16;
  }
  else {
    if (*(long *)(in_RDI + 0x70) != 0) {
      uv_timer_stop(in_stack_ffffffffffffffe8);
      uv_timer_start(unaff_retaddr,
                     (uv_timer_cb)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     in_RDI,(uint64_t)in_stack_ffffffffffffffe8);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int uv_timer_again(uv_timer_t* handle) {
  if (handle->timer_cb == NULL)
    return -EINVAL;

  if (handle->repeat) {
    uv_timer_stop(handle);
    uv_timer_start(handle, handle->timer_cb, handle->repeat, handle->repeat);
  }

  return 0;
}